

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_scan.cpp
# Opt level: O0

char * ON_String::ToNumber(char *buffer,ON__UINT64 value_on_failure,ON__UINT64 *value)

{
  char *pcVar1;
  bool bVar2;
  ON__UINT64 r1;
  ON__UINT64 d;
  char *s;
  ON__UINT64 r;
  char *rc;
  ON__UINT64 u;
  ON__UINT64 *value_local;
  ON__UINT64 value_on_failure_local;
  char *buffer_local;
  
  if (value == (ON__UINT64 *)0x0) {
    buffer_local = (char *)0x0;
  }
  else {
    r = 0;
    rc = (char *)value_on_failure;
    if (buffer != (char *)0x0) {
      value_on_failure_local = (ON__UINT64)buffer;
      if (*buffer == '+') {
        value_on_failure_local = (ON__UINT64)(buffer + 1);
      }
      if (('/' < *(char *)value_on_failure_local) && (*(char *)value_on_failure_local < ':')) {
        s = (char *)(long)(*(char *)value_on_failure_local + -0x30);
        do {
          d = value_on_failure_local + 1;
          if ((*(char *)d < '0') || ('9' < *(char *)d)) {
            rc = s;
            r = d;
            break;
          }
          pcVar1 = (char *)((long)s * 10 + (long)(*(char *)d + -0x30));
          bVar2 = s <= pcVar1;
          s = pcVar1;
          value_on_failure_local = d;
        } while (bVar2);
      }
    }
    *value = (ON__UINT64)rc;
    buffer_local = (char *)r;
  }
  return buffer_local;
}

Assistant:

const char* ON_String::ToNumber(
  const char* buffer,
  ON__UINT64 value_on_failure,
  ON__UINT64* value
  )
{
  if (nullptr == value)
    return nullptr;

  ON__UINT64 u = value_on_failure;
  const char* rc = nullptr;

  if (nullptr != buffer)
  {
    if ('+' == buffer[0])
      buffer++;
    if (buffer[0] >= '0' && buffer[0] <= '9')
    {
      ON__UINT64 r = (ON__UINT64)(*buffer++ - '0');
      for (const char* s = buffer;/*empty test*/; s++)
      {
        if (*s >= '0' && *s <= '9')
        {
          ON__UINT64 d = ON__UINT64(*s - '0');
          ON__UINT64 r1 = r * 10LLU + d;
          if (r1 < r)
          {
            // overflow
            break;
          }
          r = r1;
          continue;
        }
        u = r;
        rc = s;
        break;
      }
    }
  }

  *value = u;
  return rc;
}